

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_parse_alpn_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  int iVar1;
  size_t sVar2;
  ulong __n;
  char **local_60;
  char **ours;
  uchar *end;
  uchar *start;
  uchar *theirs;
  size_t ours_len;
  size_t cur_len;
  size_t list_len;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->conf->alpn_list == (char **)0x0) {
    ssl_local._4_4_ = 0;
  }
  else if (len < 4) {
    ssl_local._4_4_ = -0x7900;
  }
  else if ((long)(int)(uint)CONCAT11(*buf,buf[1]) == len - 2) {
    for (local_60 = ssl->conf->alpn_list; *local_60 != (char *)0x0; local_60 = local_60 + 1) {
      sVar2 = strlen(*local_60);
      for (start = buf + 2; start != buf + len; start = start + 1 + __n) {
        if (buf + len < start) {
          return -0x7900;
        }
        __n = (ulong)*start;
        if (__n == 0) {
          return -0x7900;
        }
        if ((__n == sVar2) && (iVar1 = memcmp(start + 1,*local_60,__n), iVar1 == 0)) {
          ssl->alpn_chosen = *local_60;
          return 0;
        }
      }
    }
    mbedtls_ssl_send_alert_message(ssl,'\x02','x');
    ssl_local._4_4_ = -0x7900;
  }
  else {
    ssl_local._4_4_ = -0x7900;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_alpn_ext( mbedtls_ssl_context *ssl,
                               const unsigned char *buf, size_t len )
{
    size_t list_len, name_len;
    const char **p;

    /* If we didn't send it, the server shouldn't send it */
    if( ssl->conf->alpn_list == NULL )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    /*
     * opaque ProtocolName<1..2^8-1>;
     *
     * struct {
     *     ProtocolName protocol_name_list<2..2^16-1>
     * } ProtocolNameList;
     *
     * the "ProtocolNameList" MUST contain exactly one "ProtocolName"
     */

    /* Min length is 2 (list_len) + 1 (name_len) + 1 (name) */
    if( len < 4 )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    list_len = ( buf[0] << 8 ) | buf[1];
    if( list_len != len - 2 )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    name_len = buf[2];
    if( name_len != list_len - 1 )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );

    /* Check that the server chosen protocol was in our list and save it */
    for( p = ssl->conf->alpn_list; *p != NULL; p++ )
    {
        if( name_len == strlen( *p ) &&
            memcmp( buf + 3, *p, name_len ) == 0 )
        {
            ssl->alpn_chosen = *p;
            return( 0 );
        }
    }

    return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
}